

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaMuxes.c
# Opt level: O2

Gia_Man_t * Gia_ManDupMuxes(Gia_Man_t *p,int Limit)

{
  uint uVar1;
  int iVar2;
  int iVar3;
  Gia_Man_t *p_00;
  char *pcVar4;
  uint *puVar5;
  int *piVar6;
  Gia_Obj_t *pGVar7;
  Gia_Obj_t *pGVar8;
  Gia_Man_t *pGVar9;
  long lVar10;
  long lVar11;
  Gia_Obj_t *pFan1;
  Gia_Obj_t *pFan0;
  int local_40;
  int local_3c;
  ulong local_38;
  
  if (p->pMuxes == (uint *)0x0) {
    if (-1 < Limit) {
      local_3c = Limit;
      if (p->pRefs != (int *)0x0) {
        free(p->pRefs);
        p->pRefs = (int *)0x0;
      }
      Gia_ManCreateRefs(p);
      p_00 = Gia_ManStart(p->nObjs);
      pcVar4 = Abc_UtilStrsav(p->pName);
      p_00->pName = pcVar4;
      pcVar4 = Abc_UtilStrsav(p->pSpec);
      p_00->pSpec = pcVar4;
      iVar2 = p_00->nObjsAlloc;
      puVar5 = (uint *)calloc((long)iVar2,4);
      p_00->pMuxes = puVar5;
      if (p->pSibls != (int *)0x0) {
        piVar6 = (int *)calloc((long)iVar2,4);
        p_00->pSibls = piVar6;
      }
      p->pObjs->Value = 0;
      Gia_ManHashStart(p_00);
      local_38 = 0x9fffffff;
      lVar10 = 0x100000000;
      for (lVar11 = 1; lVar11 < p->nObjs; lVar11 = lVar11 + 1) {
        pGVar7 = Gia_ManObj(p,(int)lVar11);
        if (pGVar7 == (Gia_Obj_t *)0x0) break;
        uVar1 = (uint)*(undefined8 *)pGVar7;
        if ((uVar1 & 0x9fffffff) == local_38) {
          uVar1 = Gia_ManAppendCi(p_00);
        }
        else if ((~uVar1 & 0x1fffffff) == 0 || -1 < (int)uVar1) {
          iVar2 = Gia_ObjIsBuf(pGVar7);
          if (iVar2 == 0) {
            iVar2 = Gia_ObjIsMuxType(pGVar7);
            if ((iVar2 == 0) ||
               ((piVar6 = p->pSibls, piVar6 != (int *)0x0 &&
                ((*(int *)((long)piVar6 +
                          ((long)((ulong)((uint)*(undefined8 *)pGVar7 & 0x1fffffff) * -0x100000000 +
                                 lVar10) >> 0x1e)) != 0 ||
                 (*(int *)((long)piVar6 +
                          ((long)((ulong)((uint)((ulong)*(undefined8 *)pGVar7 >> 0x20) & 0x1fffffff)
                                  * -0x100000000 + lVar10) >> 0x1e)) != 0)))))) {
LAB_001fbb0b:
              iVar2 = Gia_ObjFanin0Copy(pGVar7);
              iVar3 = Gia_ObjFanin1Copy(pGVar7);
              uVar1 = Gia_ManHashAnd(p_00,iVar2,iVar3);
            }
            else {
              iVar2 = Gia_ObjRecognizeExor(pGVar7,&pFan0,&pFan1);
              if (iVar2 == 0) {
                iVar2 = Gia_ObjRefNum(p,pGVar7 + -(*(ulong *)pGVar7 & 0x1fffffff));
                iVar3 = Gia_ObjRefNum(p,pGVar7 + -((ulong)*(uint *)&pGVar7->field_0x4 & 0x1fffffff))
                ;
                if (local_3c < iVar3 + iVar2) goto LAB_001fbb0b;
                pGVar8 = Gia_ObjRecognizeMux(pGVar7,&pFan1,&pFan0);
                iVar2 = Gia_ObjToLit(p,pGVar8);
                local_40 = Gia_ObjLitCopy(p,iVar2);
                iVar2 = Gia_ObjToLit(p,pFan1);
                iVar2 = Gia_ObjLitCopy(p,iVar2);
                iVar3 = Gia_ObjToLit(p,pFan0);
                iVar3 = Gia_ObjLitCopy(p,iVar3);
                uVar1 = Gia_ManHashMuxReal(p_00,local_40,iVar2,iVar3);
              }
              else {
                iVar2 = Gia_ObjToLit(p,pFan0);
                iVar2 = Gia_ObjLitCopy(p,iVar2);
                iVar3 = Gia_ObjToLit(p,pFan1);
                iVar3 = Gia_ObjLitCopy(p,iVar3);
                uVar1 = Gia_ManHashXorReal(p_00,iVar2,iVar3);
              }
            }
          }
          else {
            iVar2 = Gia_ObjFanin0Copy(pGVar7);
            uVar1 = Gia_ManAppendBuf(p_00,iVar2);
          }
        }
        else {
          iVar2 = Gia_ObjFanin0Copy(pGVar7);
          uVar1 = Gia_ManAppendCo(p_00,iVar2);
        }
        pGVar7->Value = uVar1;
        if ((p->pSibls != (int *)0x0) && (p->pSibls[lVar11] != 0)) {
          iVar2 = Abc_Lit2Var(uVar1);
          pGVar7 = Gia_ManObj(p_00,iVar2);
          pGVar8 = Gia_ManObj(p,p->pSibls[lVar11]);
          iVar2 = Abc_Lit2Var(pGVar8->Value);
          pGVar8 = Gia_ManObj(p_00,iVar2);
          if (((~*(uint *)pGVar7 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar7) &&
             ((~*(uint *)pGVar8 & 0x1fffffff) != 0 && -1 < (int)*(uint *)pGVar8)) {
            iVar2 = Gia_ObjId(p_00,pGVar7);
            iVar3 = Gia_ObjId(p_00,pGVar8);
            if (iVar3 < iVar2) {
              iVar2 = Gia_ObjId(p_00,pGVar8);
              piVar6 = p_00->pSibls;
              iVar3 = Gia_ObjId(p_00,pGVar7);
              piVar6[iVar3] = iVar2;
            }
          }
        }
        lVar10 = lVar10 + 0x100000000;
      }
      Gia_ManHashStop(p_00);
      Gia_ManSetRegNum(p_00,p->nRegs);
      pGVar9 = Gia_ManCleanup(p_00);
      Gia_ManStop(p_00);
      return pGVar9;
    }
    pcVar4 = "Limit >= 0";
    uVar1 = 0x68;
  }
  else {
    pcVar4 = "p->pMuxes == NULL";
    uVar1 = 0x67;
  }
  __assert_fail(pcVar4,
                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaMuxes.c"
                ,uVar1,"Gia_Man_t *Gia_ManDupMuxes(Gia_Man_t *, int)");
}

Assistant:

Gia_Man_t * Gia_ManDupMuxes( Gia_Man_t * p, int Limit )
{
    Gia_Man_t * pNew, * pTemp;
    Gia_Obj_t * pObj, * pFan0, * pFan1, * pFanC, * pSiblNew, * pObjNew;
    int i;
    assert( p->pMuxes == NULL );
    assert( Limit >= 0 ); // allows to create AIG with XORs without MUXes
    ABC_FREE( p->pRefs );
    Gia_ManCreateRefs( p ); 
    // start the new manager
    pNew = Gia_ManStart( Gia_ManObjNum(p) );
    pNew->pName = Abc_UtilStrsav( p->pName );
    pNew->pSpec = Abc_UtilStrsav( p->pSpec );
    pNew->pMuxes = ABC_CALLOC( unsigned, pNew->nObjsAlloc );
    if ( Gia_ManHasChoices(p) )
        pNew->pSibls = ABC_CALLOC( int, pNew->nObjsAlloc );
    Gia_ManConst0(p)->Value = 0;
    Gia_ManHashStart( pNew );
    Gia_ManForEachObj1( p, pObj, i )
    {
        if ( Gia_ObjIsCi(pObj) )
            pObj->Value = Gia_ManAppendCi( pNew );
        else if ( Gia_ObjIsCo(pObj) )
            pObj->Value = Gia_ManAppendCo( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( Gia_ObjIsBuf(pObj) )
            pObj->Value = Gia_ManAppendBuf( pNew, Gia_ObjFanin0Copy(pObj) );
        else if ( !Gia_ObjIsMuxType(pObj) || Gia_ObjSibl(p, Gia_ObjFaninId0(pObj, i)) || Gia_ObjSibl(p, Gia_ObjFaninId1(pObj, i)) )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else if ( Gia_ObjRecognizeExor(pObj, &pFan0, &pFan1) )
            pObj->Value = Gia_ManHashXorReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)) );
        else if ( Gia_ObjRefNum(p, Gia_ObjFanin0(pObj)) + Gia_ObjRefNum(p, Gia_ObjFanin1(pObj)) > Limit )
            pObj->Value = Gia_ManHashAnd( pNew, Gia_ObjFanin0Copy(pObj), Gia_ObjFanin1Copy(pObj) );
        else
        {
            pFanC = Gia_ObjRecognizeMux( pObj, &pFan1, &pFan0 );
            pObj->Value = Gia_ManHashMuxReal( pNew, Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFanC)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan1)), Gia_ObjLitCopy(p, Gia_ObjToLit(p, pFan0)) );
        }
        if ( !Gia_ObjSibl(p, i) )
            continue;
        pObjNew  = Gia_ManObj( pNew, Abc_Lit2Var(pObj->Value) );
        pSiblNew = Gia_ManObj( pNew, Abc_Lit2Var(Gia_ObjSiblObj(p, i)->Value) );
        if ( Gia_ObjIsAnd(pObjNew) && Gia_ObjIsAnd(pSiblNew) && Gia_ObjId(pNew, pObjNew) > Gia_ObjId(pNew, pSiblNew) )
            pNew->pSibls[Gia_ObjId(pNew, pObjNew)] = Gia_ObjId(pNew, pSiblNew);
    }
    Gia_ManHashStop( pNew );
    Gia_ManSetRegNum( pNew, Gia_ManRegNum(p) );
    // perform cleanup
    pNew = Gia_ManCleanup( pTemp = pNew );
    Gia_ManStop( pTemp );
    return pNew;
}